

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

MPP_RET dec_task_info_init(HalTaskInfo *task)

{
  HalDecTask *p;
  HalTaskInfo *task_local;
  
  (task->dec).valid = 0;
  (task->dec).flags.val = 0;
  (task->dec).flags.val = (task->dec).flags.val & 0xfffffffffffffffe;
  (task->dec).input_packet = (MppPacket)0x0;
  (task->dec).output = -1;
  (task->dec).input = -1;
  memset(&(task->dec).syntax,0,0x10);
  memset((task->dec).refer,0xff,0x44);
  return MPP_OK;
}

Assistant:

MPP_RET dec_task_info_init(HalTaskInfo *task)
{
    HalDecTask *p = &task->dec;

    p->valid  = 0;
    p->flags.val = 0;
    p->flags.eos = 0;
    p->input_packet = NULL;
    p->output = -1;
    p->input = -1;
    memset(&task->dec.syntax, 0, sizeof(task->dec.syntax));
    memset(task->dec.refer, -1, sizeof(task->dec.refer));

    return MPP_OK;
}